

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  byte bVar1;
  char *pcVar2;
  sqlite3_int64 sVar3;
  int iVar4;
  char *pcVar5;
  char *p_00;
  int iVar6;
  char *pEnd;
  char *pEnd_00;
  int iVar7;
  char *p_01;
  uint bDescIdx;
  long in_FS_OFFSET;
  int local_bc;
  int local_6c;
  char *local_68;
  char *p2;
  char *p1;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar6 = p->iDoclistToken;
    if (iVar6 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      p_01 = (p->doclist).aAll;
      if (p_01 != (char *)0x0) {
        iVar4 = (p->doclist).nAll;
        local_bc = iVar6 - iToken;
        p_00 = pList;
        iVar7 = nList;
        if (iVar6 < iToken) {
          local_bc = iToken - iVar6;
          p_00 = p_01;
          p_01 = pList;
          iVar7 = iVar4;
          iVar4 = nList;
        }
        bVar1 = pTab->bDescIdx;
        i1 = 0;
        i2 = 0;
        iPrev = 0;
        local_6c = 0;
        pcVar5 = p_01;
        p2 = p_01;
        p1 = p_00;
        if ((bVar1 == 0) ||
           (pcVar5 = (char *)sqlite3_malloc64((long)iVar4 + 10), pcVar5 != (char *)0x0)) {
          pEnd_00 = p_00 + iVar7;
          pEnd = p_01 + iVar4;
          local_68 = pcVar5;
          fts3GetDeltaVarint3(&p1,pEnd_00,0,&i1);
          fts3GetDeltaVarint3(&p2,pEnd,0,&i2);
          while( true ) {
            sVar3 = iPrev;
            pcVar2 = local_68;
            iVar6 = local_6c;
            bDescIdx = (uint)bVar1;
            if ((p1 == (char *)0x0) || (p2 == (char *)0x0)) break;
            iVar4 = -(uint)(i1 != i2);
            if (i2 < i1) {
              iVar4 = 1;
            }
            iVar7 = -iVar4;
            if (bDescIdx == 0) {
              iVar7 = iVar4;
            }
            if (iVar7 == 0) {
              fts3PutDeltaVarint3(&local_68,bDescIdx,&iPrev,&local_6c,i1);
              iVar4 = fts3PoslistPhraseMerge(&local_68,local_bc,0,1,&p1,&p2);
              if (iVar4 == 0) {
                local_6c = iVar6;
                local_68 = pcVar2;
                iPrev = sVar3;
              }
              fts3GetDeltaVarint3(&p1,pEnd_00,bDescIdx,&i1);
              fts3GetDeltaVarint3(&p2,pEnd,bDescIdx,&i2);
            }
            else if (iVar7 < 0) {
              fts3PoslistCopy((char **)0x0,&p1);
              fts3GetDeltaVarint3(&p1,pEnd_00,bDescIdx,&i1);
            }
            else {
              fts3PoslistCopy((char **)0x0,&p2);
              fts3GetDeltaVarint3(&p2,pEnd,(uint)bVar1,&i2);
            }
          }
          iVar4 = (int)local_68 - (int)pcVar5;
          iVar6 = 0;
          if (bVar1 != 0) {
            sqlite3_free(p_01);
            p_01 = pcVar5;
          }
        }
        else {
          iVar6 = 7;
        }
        sqlite3_free(p_00);
        (p->doclist).aAll = p_01;
        (p->doclist).nAll = iVar4;
        goto LAB_001b29cd;
      }
      sqlite3_free(pList);
    }
  }
  iVar6 = 0;
LAB_001b29cd:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}